

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

bool q_evaluateRhiConfigRecursive
               (QWidget *w,QPlatformBackingStoreRhiConfig *outConfig,SurfaceType *outType)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  SurfaceType SVar4;
  bool extraout_DL;
  long lVar5;
  int iVar6;
  QWidget *w_00;
  long in_FS_OFFSET;
  bool bVar7;
  undefined1 *local_48;
  undefined4 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40._0_1_ = true;
  local_40._1_3_ = 0xaaaaaa;
  local_48 = (undefined1 *)(**(code **)(**(long **)&w->field_0x8 + 0x40))();
  local_40._0_1_ = extraout_DL;
  if (((ulong)local_48 & 1) == 0) {
    lVar1 = *(long *)(*(long *)&w->field_0x8 + 0x28);
    bVar7 = lVar1 != 0;
    if (bVar7) {
      lVar2 = *(long *)(*(long *)&w->field_0x8 + 0x20);
      lVar5 = 0;
      do {
        w_00 = *(QWidget **)(lVar2 + lVar5);
        if ((w_00 == (QWidget *)0x0) || ((*(byte *)(*(long *)&w_00->field_0x8 + 0x30) & 1) == 0)) {
          w_00 = (QWidget *)0x0;
        }
        iVar6 = 0;
        if ((w_00 != (QWidget *)0x0) &&
           (bVar3 = q_evaluateRhiConfigRecursive(w_00,outConfig,outType), iVar6 = 0, bVar3)) {
          if (q_evaluateRhiConfigRecursive(QWidget_const*,QPlatformBackingStoreRhiConfig*,QSurface::SurfaceType*)
              ::optOut == '\0') {
            q_evaluateRhiConfigRecursive();
          }
          if ((q_evaluateRhiConfigRecursive::optOut != false) ||
             (iVar6 = 3, (*(byte *)(*(long *)&w_00->field_0x8 + 0x248) & 0x10) == 0)) {
            iVar6 = 1;
          }
        }
        if ((iVar6 != 3) && (iVar6 != 0)) break;
        lVar5 = lVar5 + 8;
        bVar7 = lVar1 << 3 != lVar5;
      } while (bVar7);
    }
  }
  else {
    if (outConfig != (QPlatformBackingStoreRhiConfig *)0x0) {
      outConfig->m_debugLayer = extraout_DL;
      outConfig->m_enable = (bool)(char)local_48;
      *(int3 *)&outConfig->field_0x1 = (int3)((ulong)local_48 >> 8);
      outConfig->m_api = (int)((ulong)local_48 >> 0x20);
    }
    bVar7 = true;
    if (outType != (SurfaceType *)0x0) {
      SVar4 = QBackingStoreRhiSupport::surfaceTypeForConfig
                        ((QPlatformBackingStoreRhiConfig *)&local_48);
      *outType = SVar4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

static bool q_evaluateRhiConfigRecursive(const QWidget *w, QPlatformBackingStoreRhiConfig *outConfig, QSurface::SurfaceType *outType)
{
    QPlatformBackingStoreRhiConfig config = QWidgetPrivate::get(w)->rhiConfig();
    if (config.isEnabled()) {
        if (outConfig)
            *outConfig = config;
        if (outType)
            *outType = QBackingStoreRhiSupport::surfaceTypeForConfig(config);
        return true;
    }
    for (const QObject *child : w->children()) {
        if (const QWidget *childWidget = qobject_cast<const QWidget *>(child)) {
            if (q_evaluateRhiConfigRecursive(childWidget, outConfig, outType)) {
                static bool optOut = qEnvironmentVariableIsSet("QT_WIDGETS_NO_CHILD_RHI");
                // Native child widgets should not trigger RHI for its parent
                // hierarchy, but will still flush the native child using RHI.
                if (!optOut && childWidget->testAttribute(Qt::WA_NativeWindow))
                    continue;

                return true;
            }
        }
    }
    return false;
}